

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1be8a27::AV1Convolve2DCopyHighbdCompoundTest_RunTest_Test::TestBody
          (AV1Convolve2DCopyHighbdCompoundTest_RunTest_Test *this)

{
  uint uVar1;
  int width;
  int iVar2;
  int iVar3;
  int iVar4;
  ParamType *pPVar5;
  int iVar6;
  CompoundParam *compound;
  byte *pbVar7;
  ConvolveParams conv_params_2;
  vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
  compound_params;
  uint16_t test [16384];
  CONV_BUF_TYPE reference_conv_buf [16384];
  uint16_t reference [16384];
  ConvolveParams CStack_200d8;
  _func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int
  *p_Stack_200a8;
  uint16_t *puStack_200a0;
  uint16_t *puStack_20098;
  uint16_t *puStack_20090;
  uint16_t *puStack_20088;
  byte *pbStack_20080;
  byte *pbStack_20078;
  byte *pbStack_20070;
  ConvolveParams aCStack_20060 [682];
  uint16_t auStack_18060 [16384];
  undefined1 auStack_10060 [65584];
  
  GetCompoundParams();
  pbStack_20080 = pbStack_20070;
  if (pbStack_20078 != pbStack_20070) {
    puStack_20088 =
         (this->super_AV1Convolve2DCopyHighbdCompoundTest).
         super_AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
         .input16_1_;
    puStack_20090 =
         (this->super_AV1Convolve2DCopyHighbdCompoundTest).
         super_AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
         .input16_2_;
    pbVar7 = pbStack_20078;
    do {
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      uVar1 = (pPVar5->block_).width_;
      width = (pPVar5->block_).height_;
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      puStack_20098 =
           AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
           ::RandomInput16((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                            *)this,puStack_20088,pPVar5);
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      puStack_200a0 =
           AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
           ::RandomInput16((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                            *)this,puStack_20090,pPVar5);
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      iVar6 = (pPVar5->block_).width_;
      iVar2 = (pPVar5->block_).height_;
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      iVar3 = pPVar5->bd_;
      aCStack_20060[0].is_compound = 1;
      aCStack_20060[0].round_0 = 3;
      aCStack_20060[0].round_1 = 7;
      if (10 < iVar3) {
        aCStack_20060[0].round_0 = iVar3 + -7;
      }
      iVar4 = aCStack_20060[0].round_0;
      aCStack_20060[0].dst = (CONV_BUF_TYPE *)auStack_10060;
      aCStack_20060[0].dst_stride = 0x80;
      aCStack_20060[0].plane = 0;
      aCStack_20060[0].do_average = 0;
      aCStack_20060[0].use_dist_wtd_comp_avg = (int)*pbVar7;
      aCStack_20060[0]._40_8_ = *(undefined8 *)(pbVar7 + 4);
      av1_highbd_dist_wtd_convolve_2d_copy_c
                (puStack_20098,iVar6,(uint16_t *)(auStack_10060 + 0x8000),0x80,iVar6,iVar2,
                 aCStack_20060,iVar3);
      aCStack_20060[0].do_average = 1;
      aCStack_20060[0].dst = (CONV_BUF_TYPE *)auStack_10060;
      aCStack_20060[0]._40_8_ = *(undefined8 *)(pbVar7 + 4);
      aCStack_20060[0].dst_stride = 0x80;
      aCStack_20060[0].round_1 = 7;
      aCStack_20060[0].plane = 0;
      aCStack_20060[0].is_compound = 1;
      aCStack_20060[0].use_dist_wtd_comp_avg = (int)*pbVar7;
      aCStack_20060[0].round_0 = iVar4;
      av1_highbd_dist_wtd_convolve_2d_copy_c
                (puStack_200a0,iVar6,(uint16_t *)(auStack_10060 + 0x8000),0x80,iVar6,iVar2,
                 aCStack_20060,iVar3);
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      p_Stack_200a8 = pPVar5->test_func_;
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      iVar6 = (pPVar5->block_).width_;
      iVar2 = (pPVar5->block_).height_;
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      iVar3 = pPVar5->bd_;
      CStack_200d8.is_compound = 1;
      CStack_200d8.round_0 = 3;
      CStack_200d8.round_1 = 7;
      if (10 < iVar3) {
        CStack_200d8.round_0 = iVar3 + -7;
      }
      iVar4 = CStack_200d8.round_0;
      CStack_200d8.dst = auStack_18060;
      CStack_200d8.dst_stride = 0x80;
      CStack_200d8.plane = 0;
      CStack_200d8.do_average = 0;
      CStack_200d8.use_dist_wtd_comp_avg = (int)*pbVar7;
      CStack_200d8._40_8_ = *(undefined8 *)(pbVar7 + 4);
      (*p_Stack_200a8)(puStack_20098,iVar6,(unsigned_short *)aCStack_20060,0x80,iVar6,iVar2,
                       &CStack_200d8,iVar3);
      CStack_200d8.do_average = 1;
      CStack_200d8.dst = auStack_18060;
      CStack_200d8._40_8_ = *(undefined8 *)(pbVar7 + 4);
      CStack_200d8.dst_stride = 0x80;
      CStack_200d8.round_1 = 7;
      CStack_200d8.plane = 0;
      CStack_200d8.is_compound = 1;
      CStack_200d8.use_dist_wtd_comp_avg = (int)*pbVar7;
      CStack_200d8.round_0 = iVar4;
      (*p_Stack_200a8)(puStack_200a0,iVar6,(unsigned_short *)aCStack_20060,0x80,iVar6,iVar2,
                       &CStack_200d8,iVar3);
      AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
      ::AssertOutputBufferEq
                ((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                  *)auStack_10060,auStack_18060,(uint16_t *)(ulong)uVar1,width,iVar6);
      AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
      ::AssertOutputBufferEq
                ((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                  *)(auStack_10060 + 0x8000),(uint16_t *)aCStack_20060,(uint16_t *)(ulong)uVar1,
                 width,iVar6);
      pbVar7 = pbVar7 + 0xc;
    } while (pbVar7 != pbStack_20080);
  }
  if (pbStack_20078 != (byte *)0x0) {
    operator_delete(pbStack_20078);
  }
  return;
}

Assistant:

TEST_P(AV1Convolve2DCopyHighbdCompoundTest, RunTest) { RunTest(); }